

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

int ReadLine(char *buffer,size_t size,_func_int *ReadFunction)

{
  bool bVar1;
  int iVar2;
  int local_2c;
  int bytesProcessed;
  bool done;
  char c;
  int i;
  _func_int *ReadFunction_local;
  size_t size_local;
  char *buffer_local;
  
  bVar1 = false;
  local_2c = 0;
  size_local = (size_t)buffer;
  do {
    if (bVar1) break;
    iVar2 = (*ReadFunction)();
    if (iVar2 == -1) {
      *(undefined1 *)size_local = 0;
      break;
    }
    bytesProcessed._0_1_ = (char)iVar2;
    local_2c = local_2c + 1;
    if ((char)bytesProcessed == '\n') {
      *(undefined1 *)size_local = 0;
      bVar1 = true;
    }
    else if ((char)bytesProcessed == '\r') {
      *(undefined1 *)size_local = 0;
    }
    else {
      *(char *)size_local = (char)bytesProcessed;
    }
    size_local = size_local + 1;
  } while ((long)local_2c != size);
  *(undefined1 *)size_local = 0;
  return local_2c;
}

Assistant:

int ReadLine(char* buffer, size_t size, int (*ReadFunction)())
{
    int i;
    char c;
    bool done = false;
    int bytesProcessed = 0;

    while (!done)
    {
        i = ReadFunction();
        if (i == -1)
        {
            *buffer = 0;
            break;
        }
        c = (char)i;
        bytesProcessed++;
        switch (c)
        {
        case '\r': *buffer++ = 0; break;
        case '\n':
            *buffer++ = 0;
            done = true;
            break;
        default: *buffer++ = c; break;
        }

        if (bytesProcessed == size)
        {
            break;
        }
    }

    *buffer = 0;
    return bytesProcessed;
}